

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O0

Chromosome * __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::findFittestChromosome
          (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  size_t sVar3;
  reference pCVar4;
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  local_18;
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  result;
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *this_local;
  
  result._M_current = (Chromosome<Gen,_ComputeFitness> *)this;
  cVar1 = std::
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ::begin(&this->_chromosomes);
  cVar2 = std::
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ::end(&this->_chromosomes);
  local_18 = std::
             min_element<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>const*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::findFittestChromosome()const::_lambda(crsGA::Chromosome<Gen,ComputeFitness>const&,crsGA::Chromosome<Gen,ComputeFitness>const&)_1_>
                       (cVar1._M_current,cVar2._M_current);
  cVar1 = std::
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ::begin(&this->_chromosomes);
  sVar3 = std::
          distance<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>const*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>>
                    ((__normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
                      )cVar1._M_current,local_18);
  this->_fittestChromosomeIndex = sVar3;
  pCVar4 = __gnu_cxx::
           __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
           ::operator*(&local_18);
  return pCVar4;
}

Assistant:

const Chromosome &findFittestChromosome() const
    {
        auto result = std::min_element(_chromosomes.begin(), _chromosomes.end(),
                                       [](const Chromosome &c1, const Chromosome &c2) {
                                           LOG_DEBUG("C1 Fitness:", c1.getFitness(), " C2 Fitness:", c2.getFitness());
                                           return (c1.getFitness() < c2.getFitness());
                                       });
        _fittestChromosomeIndex = std::distance(_chromosomes.begin(), result);
        return *result;
    }